

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UErrorCode __thiscall
icu_63::RuleChain::getKeywords
          (RuleChain *this,int32_t capacityOfKeywords,UnicodeString *keywords,int32_t *arraySize)

{
  int iVar1;
  UBool UVar2;
  int32_t *arraySize_local;
  UnicodeString *keywords_local;
  int32_t capacityOfKeywords_local;
  RuleChain *this_local;
  
  UVar2 = ::U_FAILURE(this->fInternalStatus);
  if (UVar2 == '\0') {
    if (*arraySize < capacityOfKeywords + -1) {
      iVar1 = *arraySize;
      *arraySize = iVar1 + 1;
      UnicodeString::operator=(keywords + iVar1,&this->fKeyword);
      if (this->fNext == (RuleChain *)0x0) {
        this_local._4_4_ = U_ZERO_ERROR;
      }
      else {
        this_local._4_4_ = getKeywords(this->fNext,capacityOfKeywords,keywords,arraySize);
      }
    }
    else {
      this_local._4_4_ = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  else {
    this_local._4_4_ = this->fInternalStatus;
  }
  return this_local._4_4_;
}

Assistant:

UErrorCode
RuleChain::getKeywords(int32_t capacityOfKeywords, UnicodeString* keywords, int32_t& arraySize) const {
    if (U_FAILURE(fInternalStatus)) {
        return fInternalStatus;
    }
    if ( arraySize < capacityOfKeywords-1 ) {
        keywords[arraySize++]=fKeyword;
    }
    else {
        return U_BUFFER_OVERFLOW_ERROR;
    }

    if ( fNext != nullptr ) {
        return fNext->getKeywords(capacityOfKeywords, keywords, arraySize);
    }
    else {
        return U_ZERO_ERROR;
    }
}